

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeWebAssemblyTablePrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined8 in_RAX;
  uint uVar5;
  StaticType *type;
  LiteralString *pLVar1;
  JavascriptMethod p_Var2;
  RuntimeFunction *pRVar3;
  RuntimeFunction *pRVar4;
  ulong uVar6;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,6,0);
  this = (((prototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar6 = (ulong)uVar5 << 0x20;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (prototype,0x67,(this->webAssemblyTableConstructor).ptr,6,0,0,uVar6);
  if (((this_00->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar1 = LiteralString::New(type,L"WebAssembly.Table",0x11,this->recycler);
    uVar6 = uVar6 & 0xffffffff00000000;
    (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x1b,pLVar1,2,0,0,uVar6);
  }
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Grow);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssemblyTable::EntryInfo::Grow,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xe4);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(prototype,0xe4,pRVar3,6,0,0,uVar6);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,&pRVar3->super_JavascriptFunction);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Get);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssemblyTable::EntryInfo::Get,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x198);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x198,pRVar3,6,0,0,uVar6);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,&pRVar3->super_JavascriptFunction);
  p_Var2 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Set);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssemblyTable::EntryInfo::Set,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x19b);
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x19b,pRVar3,6,0,0,uVar6 & 0xffffffff00000000);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var2,&pRVar3->super_JavascriptFunction);
  pRVar4 = CreateGetterFunction(this,0xd1,(FunctionInfo *)WebAssemblyTable::EntryInfo::GetterLength)
  ;
  pRVar3 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar4 == (RuntimeFunction *)0x0) {
    pRVar4 = pRVar3;
  }
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(prototype,0xd1,pRVar4,pRVar3,0);
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(prototype,0xd1,6);
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyTablePrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 6);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyTableConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Table")), PropertyConfigurable);
        }
        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Grow.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::grow, &WebAssemblyTable::EntryInfo::Grow, 1));

        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Get.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::get, &WebAssemblyTable::EntryInfo::Get, 1));

        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Set.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::set, &WebAssemblyTable::EntryInfo::Set, 2));

        library->AddAccessorsToLibraryObject(prototype, PropertyIds::length, &WebAssemblyTable::EntryInfo::GetterLength, nullptr);

        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }